

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::FindBestWindowPosForPopupEx
                 (ImVec2 *ref_pos,ImVec2 *size,ImGuiDir *last_dir,ImRect *r_outer,ImRect *r_avoid,
                 ImGuiPopupPositionPolicy policy)

{
  int iVar1;
  ImVec2 mx;
  ImRect *this;
  bool bVar2;
  ImRect *in_RCX;
  int *in_RDX;
  float *in_RSI;
  ImVec2 *in_RDI;
  float *in_R8;
  int in_R9D;
  float fVar3;
  float avail_h;
  float avail_w;
  ImGuiDir dir_1;
  int n_1;
  ImGuiDir dir_prefered_order [4];
  ImGuiDir dir;
  int n;
  ImGuiDir dir_prefered_order_1 [4];
  ImVec2 base_pos_clamped;
  ImVec2 pos;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  float local_100;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  float fVar4;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  float fVar5;
  float in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  float local_e0;
  int local_cc;
  int local_ac;
  int local_a8 [4];
  ImVec2 local_98;
  ImRect local_90;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  int local_60;
  int local_5c;
  int local_58 [5];
  ImVec2 local_44;
  ImVec2 local_3c;
  int local_34;
  float *local_30;
  ImRect *local_28;
  int *local_20;
  float *local_18;
  ImVec2 *local_10;
  ImVec2 local_8;
  
  local_34 = in_R9D;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_44 = operator-((ImVec2 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                       (ImVec2 *)0x14fb82);
  mx.y = in_stack_ffffffffffffff1c;
  mx.x = in_stack_ffffffffffffff18;
  local_3c = ImClamp((ImVec2 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (ImVec2 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),mx);
  if (local_34 == 1) {
    local_58[0] = 3;
    local_58[1] = 1;
    local_58[2] = 0;
    local_58[3] = 2;
    local_5c = 0;
    if (*local_20 != -1) {
      local_5c = -1;
    }
    for (; local_5c < 4; local_5c = local_5c + 1) {
      if (local_5c == -1) {
        local_cc = *local_20;
      }
      else {
        local_cc = local_58[local_5c];
      }
      local_60 = local_cc;
      if ((local_5c == -1) || (local_cc != *local_20)) {
        ImVec2::ImVec2(&local_8);
        if (local_60 == 3) {
          ImVec2::ImVec2(&local_68,*local_30,local_30[3]);
          local_8 = local_68;
        }
        if (local_60 == 1) {
          ImVec2::ImVec2(&local_70,*local_30,local_30[1] - local_18[1]);
          local_8 = local_70;
        }
        if (local_60 == 0) {
          ImVec2::ImVec2(&local_78,local_30[2] - *local_18,local_30[3]);
          local_8 = local_78;
        }
        if (local_60 == 2) {
          ImVec2::ImVec2(&local_80,local_30[2] - *local_18,local_30[1] - local_18[1]);
          local_8 = local_80;
        }
        this = local_28;
        local_98 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                             ,(ImVec2 *)0x14fdc1);
        ImRect::ImRect(&local_90,&local_8,&local_98);
        bVar2 = ImRect::Contains(this,&local_90);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          *local_20 = local_60;
          return local_8;
        }
      }
    }
  }
  local_a8[0] = 1;
  local_a8[1] = 3;
  local_a8[2] = 2;
  local_a8[3] = 0;
  local_ac = 0;
  if (*local_20 != -1) {
    local_ac = -1;
  }
  do {
    if (3 < local_ac) {
      *local_20 = -1;
      local_8 = *local_10;
      fVar3 = ImMin<float>(local_8.x + *local_18,(local_28->Max).x);
      fVar3 = ImMax<float>(fVar3 - *local_18,(local_28->Min).x);
      local_8.x = fVar3;
      fVar3 = ImMin<float>(local_8.y + local_18[1],(local_28->Max).y);
      fVar3 = ImMax<float>(fVar3 - local_18[1],(local_28->Min).y);
      local_8.y = fVar3;
      return local_8;
    }
    if (local_ac == -1) {
      iVar1 = *local_20;
LAB_0014feab:
      if (iVar1 == 0) {
        local_e0 = *local_30;
      }
      else {
        local_e0 = (local_28->Max).x;
      }
      if (iVar1 == 1) {
        fVar3 = local_30[2];
      }
      else {
        fVar3 = (local_28->Min).x;
      }
      if (iVar1 == 2) {
        fVar5 = local_30[1];
      }
      else {
        fVar5 = (local_28->Max).y;
      }
      if (iVar1 == 3) {
        fVar4 = local_30[3];
      }
      else {
        fVar4 = (local_28->Min).y;
      }
      if ((*local_18 <= local_e0 - fVar3) && (local_18[1] <= fVar5 - fVar4)) {
        ImVec2::ImVec2(&local_8);
        if (iVar1 == 0) {
          local_8.x = *local_30 - *local_18;
        }
        else if (iVar1 == 1) {
          local_8.x = local_30[2];
        }
        else {
          local_8.x = local_3c.x;
        }
        if (iVar1 == 2) {
          local_100 = local_30[1] - local_18[1];
        }
        else if (iVar1 == 3) {
          local_100 = local_30[3];
        }
        else {
          local_100 = local_3c.y;
        }
        local_8.y = local_100;
        *local_20 = iVar1;
        return local_8;
      }
    }
    else {
      iVar1 = local_a8[local_ac];
      if (iVar1 != *local_20) goto LAB_0014feab;
    }
    local_ac = local_ac + 1;
  } while( true );
}

Assistant:

ImVec2 ImGui::FindBestWindowPosForPopupEx(const ImVec2& ref_pos, const ImVec2& size, ImGuiDir* last_dir, const ImRect& r_outer, const ImRect& r_avoid, ImGuiPopupPositionPolicy policy)
{
    ImVec2 base_pos_clamped = ImClamp(ref_pos, r_outer.Min, r_outer.Max - size);
    //GImGui->OverlayDrawList.AddRect(r_avoid.Min, r_avoid.Max, IM_COL32(255,0,0,255));
    //GImGui->OverlayDrawList.AddRect(r_outer.Min, r_outer.Max, IM_COL32(0,255,0,255));

    // Combo Box policy (we want a connecting edge)
    if (policy == ImGuiPopupPositionPolicy_ComboBox)
    {
        const ImGuiDir dir_prefered_order[ImGuiDir_COUNT] = { ImGuiDir_Down, ImGuiDir_Right, ImGuiDir_Left, ImGuiDir_Up };
        for (int n = (*last_dir != ImGuiDir_None) ? -1 : 0; n < ImGuiDir_COUNT; n++)
        {
            const ImGuiDir dir = (n == -1) ? *last_dir : dir_prefered_order[n];
            if (n != -1 && dir == *last_dir) // Already tried this direction?
                continue;
            ImVec2 pos;
            if (dir == ImGuiDir_Down)  pos = ImVec2(r_avoid.Min.x, r_avoid.Max.y);          // Below, Toward Right (default)
            if (dir == ImGuiDir_Right) pos = ImVec2(r_avoid.Min.x, r_avoid.Min.y - size.y); // Above, Toward Right
            if (dir == ImGuiDir_Left)  pos = ImVec2(r_avoid.Max.x - size.x, r_avoid.Max.y); // Below, Toward Left
            if (dir == ImGuiDir_Up)    pos = ImVec2(r_avoid.Max.x - size.x, r_avoid.Min.y - size.y); // Above, Toward Left
            if (!r_outer.Contains(ImRect(pos, pos + size)))
                continue;
            *last_dir = dir;
            return pos;
        }
    }

    // Default popup policy
    const ImGuiDir dir_prefered_order[ImGuiDir_COUNT] = { ImGuiDir_Right, ImGuiDir_Down, ImGuiDir_Up, ImGuiDir_Left };
    for (int n = (*last_dir != ImGuiDir_None) ? -1 : 0; n < ImGuiDir_COUNT; n++)
    {
        const ImGuiDir dir = (n == -1) ? *last_dir : dir_prefered_order[n];
        if (n != -1 && dir == *last_dir) // Already tried this direction?
            continue;
        float avail_w = (dir == ImGuiDir_Left ? r_avoid.Min.x : r_outer.Max.x) - (dir == ImGuiDir_Right ? r_avoid.Max.x : r_outer.Min.x);
        float avail_h = (dir == ImGuiDir_Up ? r_avoid.Min.y : r_outer.Max.y) - (dir == ImGuiDir_Down ? r_avoid.Max.y : r_outer.Min.y);
        if (avail_w < size.x || avail_h < size.y)
            continue;
        ImVec2 pos;
        pos.x = (dir == ImGuiDir_Left) ? r_avoid.Min.x - size.x : (dir == ImGuiDir_Right) ? r_avoid.Max.x : base_pos_clamped.x;
        pos.y = (dir == ImGuiDir_Up)   ? r_avoid.Min.y - size.y : (dir == ImGuiDir_Down)  ? r_avoid.Max.y : base_pos_clamped.y;
        *last_dir = dir;
        return pos;
    }

    // Fallback, try to keep within display
    *last_dir = ImGuiDir_None;
    ImVec2 pos = ref_pos;
    pos.x = ImMax(ImMin(pos.x + size.x, r_outer.Max.x) - size.x, r_outer.Min.x);
    pos.y = ImMax(ImMin(pos.y + size.y, r_outer.Max.y) - size.y, r_outer.Min.y);
    return pos;
}